

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O0

sftp_packet * sftp_recv_prepare(uint length)

{
  sftp_packet *psVar1;
  char *pcVar2;
  sftp_packet *pkt;
  uint length_local;
  
  psVar1 = (sftp_packet *)safemalloc(1,0x68,0);
  psVar1->savedpos = 0;
  psVar1->maxlen = (ulong)length;
  psVar1->length = (ulong)length;
  pcVar2 = (char *)safemalloc(psVar1->length,1,0);
  psVar1->data = pcVar2;
  return psVar1;
}

Assistant:

struct sftp_packet *sftp_recv_prepare(unsigned length)
{
    struct sftp_packet *pkt;

    pkt = snew(struct sftp_packet);
    pkt->savedpos = 0;
    pkt->length = pkt->maxlen = length;
    pkt->data = snewn(pkt->length, char);

    return pkt;
}